

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[29],char_const*,char[15],char[39],unsigned_int,char[3],std::__cxx11::string,char[14]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [29],char **Args_1,
          char (*Args_2) [15],char (*Args_3) [39],uint *Args_4,char (*Args_5) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_6,
          char (*Args_7) [14])

{
  stringstream local_1c8 [8];
  stringstream ss;
  uint *Args_local_4;
  char (*Args_local_3) [39];
  char (*Args_local_2) [15];
  char **Args_local_1;
  char (*Args_local) [29];
  
  std::__cxx11::stringstream::stringstream(local_1c8);
  FormatStrSS<std::__cxx11::stringstream,char[29],char_const*,char[15],char[39],unsigned_int,char[3],std::__cxx11::string,char[14]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
             (char (*) [29])this,(char **)Args,(char (*) [15])Args_1,(char (*) [39])Args_2,
             (uint *)Args_3,(char (*) [3])Args_4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_5,
             (char (*) [14])Args_6);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}